

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

bool __thiscall
soul::heart::Parser::parseWriteStream
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  bool bVar1;
  Module *pMVar2;
  Expression *pEVar3;
  Expression *args_3;
  OutputDeclaration *args_1;
  Identifier *args;
  string_view sVar4;
  pool_ptr<soul::heart::OutputDeclaration> target;
  Identifier name;
  CodeLocation writeStreamLocation;
  undefined1 local_90 [8];
  Identifier local_88;
  _Alloc_hider local_80;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_48 [2];
  
  local_80._M_p =
       (pointer)(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location.sourceCode.object;
  if ((SourceCodeText *)local_80._M_p != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_80._M_p)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_80._M_p)->super_RefCountedObject).refCount + 1;
  }
  local_78 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.location.data;
  local_88 = parseGeneralIdentifier(this);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  sVar4 = Identifier::operator_cast_to_basic_string_view(&local_88);
  sVar4._M_str = (char *)sVar4._M_len;
  sVar4._M_len = (size_t)pMVar2;
  Module::findOutput((Module *)local_90,sVar4);
  if (local_90 == (undefined1  [8])0x0) {
    Errors::cannotFindOutput<soul::Identifier&>((CompileMessage *)local_58,(Errors *)&local_88,args)
    ;
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,local_58);
    CompileMessage::~CompileMessage((CompileMessage *)local_58);
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2cada8);
  if (bVar1) {
    local_58._0_8_ = (pointer)0x700000001;
    local_58._8_8_ = 0;
    aaStack_48[0]._0_8_ = 0;
    pEVar3 = parseExpression(this,state,(Type *)local_58);
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)&aaStack_48[0]._M_allocated_capacity);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2a0190);
  }
  else {
    pEVar3 = (Expression *)0x0;
  }
  args_3 = parseExpression(this,state);
  local_70._M_allocated_capacity = (size_type)local_80._M_p;
  if ((SourceCodeText *)local_80._M_p != (SourceCodeText *)0x0) {
    *(int *)local_80._M_p = *(int *)local_80._M_p + 1;
  }
  local_70._8_8_ = local_78;
  args_1 = pool_ptr<soul::heart::OutputDeclaration>::operator*
                     ((pool_ptr<soul::heart::OutputDeclaration> *)local_90);
  local_60._M_p = (pointer)pEVar3;
  BlockBuilder::
  createStatement<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
            (&builder->super_BlockBuilder,(CodeLocation *)&local_70,args_1,
             (pool_ptr<soul::heart::Expression> *)&local_60,args_3);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_70._M_allocated_capacity);
  expectSemicolon(this);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_80);
  return true;
}

Assistant:

bool parseWriteStream (FunctionParseState& state, FunctionBuilder& builder)
    {
        auto writeStreamLocation = location;
        auto name = parseGeneralIdentifier();
        auto target = module->findOutput (name);

        pool_ptr<heart::Expression> index;

        if (target == nullptr)
            throwError (Errors::cannotFindOutput (name));

        if (matchIf (HEARTOperator::openBracket))
        {
            index = parseExpression (state, PrimitiveType::int32);
            expect (HEARTOperator::closeBracket);
        }

        auto& value = parseExpression (state);

        builder.addWriteStream (writeStreamLocation, *target, index, value);
        expectSemicolon();
        return true;
    }